

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize
               (BenchmarkContext *context)

{
  int64_t iVar1;
  __sighandler_t __handler;
  int __sig;
  string *name;
  anon_class_8_1_54a39803 local_c0;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88 [32];
  anon_class_16_2_8e986c60 local_68;
  undefined1 local_58 [8];
  StorageArray<wigwag::token> c;
  SignalType local_38;
  SignalType s;
  HandlerType handler;
  BenchmarkContext *context_local;
  
  descriptors::signal::wigwag::Ui::MakeHandler();
  wigwag::
  signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
  ::signal<,true,void>
            ((signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
              *)&local_38);
  iVar1 = BenchmarkContext::GetIterationsCount(context);
  StorageArray<wigwag::token>::StorageArray((StorageArray<wigwag::token> *)local_58,iVar1);
  local_68.s = &local_38;
  local_68.handler = (HandlerType *)&s;
  StorageArray<wigwag::token>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_1_>
            ((StorageArray<wigwag::token> *)local_58,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"handler",&local_89);
  iVar1 = BenchmarkContext::GetIterationsCount(context);
  (*context->_vptr_BenchmarkContext[2])(context,local_88,iVar1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"disconnect",&local_b1);
  iVar1 = BenchmarkContext::GetIterationsCount(context);
  local_c0.c = (StorageArray<wigwag::token> *)local_58;
  name = &local_b0;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::HandlerSize(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,name,iVar1,&local_c0);
  __sig = (int)name;
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  StorageArray<wigwag::token>::~StorageArray((StorageArray<wigwag::token> *)local_58);
  wigwag::
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  ::~signal(&local_38,__sig,__handler);
  std::function<void_()>::~function((function<void_()> *)&s);
  return;
}

Assistant:

static void HandlerSize(BenchmarkContext& context)
        {
            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(context.GetIterationsCount());

            c.Construct([&]{ return s.connect(handler); });
            context.MeasureMemory("handler", context.GetIterationsCount());
            context.Profile("disconnect", context.GetIterationsCount(), [&]{ c.Destruct(); });
        }